

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O3

uint32_t pull_le32(uchar **cursor,size_t *max)

{
  uint32_t uVar1;
  ulong __n;
  uint32_t *__src;
  uint32_t *puVar2;
  size_t sVar3;
  uint32_t local_2c;
  
  __n = *max;
  __src = (uint32_t *)*cursor;
  if (__n < 4) {
    memcpy(&local_2c,__src,__n);
    puVar2 = (uint32_t *)0x0;
    memset((void *)((long)&local_2c + __n),0,4 - __n);
    sVar3 = 0;
    __src = &local_2c;
  }
  else {
    puVar2 = __src + 1;
    sVar3 = __n - 4;
  }
  uVar1 = *__src;
  *cursor = (uchar *)puVar2;
  *max = sVar3;
  return uVar1;
}

Assistant:

uint32_t pull_le32(const unsigned char **cursor, size_t *max)
{
    leint32_t lev;
    pull_bytes(&lev, sizeof(lev), cursor, max);
    return le32_to_cpu(lev);
}